

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel_art.cpp
# Opt level: O1

void make_panda(void)

{
  ppm<26U,_22U> some;
  ppm<26U,_22U> local_6dd;
  
  memcpy(&local_6dd,&DAT_00102004,0x6d5);
  ppm<26U,_22U>::save(&local_6dd,"panda.ppm");
  return;
}

Assistant:

void make_panda() {
  constexpr unsigned char bytes[] = "   ###              ###   "
                                    "  ##### ########## #####  "
                                    " #######          ####### "
                                    " ####                #### "
                                    " ###                  ### "
                                    "  #                    #  "
                                    "  #                    #  "
                                    " #    ###        ###    # "
                                    " #   #####      #####   # "
                                    " #  #### #      # ####  # "
                                    " #  #### #      # ####  # "
                                    " #  #####        #####  # "
                                    " #   ###    ##    ###   # "
                                    "  #         ##         #  "
                                    "  ####  RRR    RRR  ####  "
                                    " ######RRRRR  RRRRR###### "
                                    " ######RRRRRRRRRRRR###### "
                                    " ######RRRRRRRRRRRR###### "
                                    " ######RRRRRRRRRRRR###### "
                                    " #######RRRRRRRRRR####### "
                                    "  #####  RRRRRRRR  ####   "
                                    "   ###    RRRRRR    ##    "
                                    "           RRRR           ";
  constexpr ppm<26, 22> some{bytes};
  some.save("panda.ppm");
}